

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void INT_EVfree_stone(CManager_conflict cm,EVstone stone_num)

{
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  uint in_ESI;
  long in_RDI;
  CMConnection in_stack_00000010;
  event_item *event;
  timespec ts_1;
  proto_action *act;
  timespec ts;
  int i;
  stone_type stone;
  event_path_data evp;
  event_path_data in_stack_ffffffffffffff78;
  CManager_conflict in_stack_ffffffffffffff80;
  stone_type in_stack_ffffffffffffff90;
  FILE *in_stack_ffffffffffffff98;
  CManager in_stack_ffffffffffffffa0;
  event_item *in_stack_ffffffffffffffa8;
  CManager in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  CMTraceType in_stack_ffffffffffffffbc;
  CManager in_stack_ffffffffffffffc0;
  timespec local_38;
  int local_24;
  stone_type local_20;
  event_path_data local_18;
  uint local_c;
  long local_8;
  
  local_18 = *(event_path_data *)(in_RDI + 0x118);
  local_c = in_ESI;
  local_8 = in_RDI;
  local_20 = stone_struct(in_stack_ffffffffffffff78,0);
  iVar1 = CMtrace_val[7];
  if (*(long *)(local_8 + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      in_stack_ffffffffffffff98 = *(FILE **)(local_8 + 0x120);
      _Var2 = getpid();
      in_stack_ffffffffffffffa0 = (CManager)(long)_Var2;
      pVar3 = pthread_self();
      fprintf(in_stack_ffffffffffffff98,"P%lxT%lx - ",in_stack_ffffffffffffffa0,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_38);
      fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
    }
    fprintf(*(FILE **)(local_8 + 0x120),"Freeing stone %d\n",(ulong)local_c);
  }
  fflush(*(FILE **)(local_8 + 0x120));
  if ((local_20 != (stone_type)0x0) && (local_20->local_id != -1)) {
    if (local_20->periodic_handle != (CMTaskHandle)0x0) {
      INT_CMremove_task((CMTaskHandle)in_stack_ffffffffffffff80);
      local_20->periodic_handle = (CMTaskHandle)0x0;
    }
    for (local_24 = 0; local_24 < local_20->proto_action_count; local_24 = local_24 + 1) {
      in_stack_ffffffffffffffc0 = (CManager)(local_20->proto_actions + local_24);
      if ((attr_list)in_stack_ffffffffffffffc0->reg_user_formats != (attr_list)0x0) {
        CMint_free_attr_list
                  (in_stack_ffffffffffffffb0,(attr_list)in_stack_ffffffffffffffa8,
                   (char *)in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20)
                  );
      }
      if ((FMFormat *)in_stack_ffffffffffffffc0->control_module_choice != (FMFormat *)0x0) {
        free(in_stack_ffffffffffffffc0->control_module_choice);
      }
      in_stack_ffffffffffffff90 = (stone_type)(ulong)*(uint *)&in_stack_ffffffffffffffc0->transports
      ;
      switch(in_stack_ffffffffffffff90) {
      case (stone_type)0x0:
      case (stone_type)0x2:
      case (stone_type)0x8:
      case (stone_type)0xc:
        break;
      case (stone_type)0x1:
        if (*(long *)&in_stack_ffffffffffffffc0->CManager_ID != 0) {
          iVar1 = CMtrace_val[7];
          if (*(long *)(local_8 + 0x120) == 0) {
            iVar1 = CMtrace_init(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
          }
          if (iVar1 != 0) {
            if (CMtrace_PID != 0) {
              in_stack_ffffffffffffff80 = *(CManager_conflict *)(local_8 + 0x120);
              _Var2 = getpid();
              pVar3 = pthread_self();
              fprintf((FILE *)in_stack_ffffffffffffff80,"P%lxT%lx - ",(long)_Var2,pVar3);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)&stack0xffffffffffffffb0);
              fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffffb0,
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
            }
            fprintf(*(FILE **)(local_8 + 0x120),"Closing and dereferencing conn %p in free stone\n",
                    *(undefined8 *)&in_stack_ffffffffffffffc0->CManager_ID);
          }
          fflush(*(FILE **)(local_8 + 0x120));
          INT_CMConnection_dereference(in_stack_00000010);
        }
        if (in_stack_ffffffffffffffc0->reg_formats != (CMFormat *)0x0) {
          free_attr_list(in_stack_ffffffffffffffc0->reg_formats);
          in_stack_ffffffffffffffc0->reg_formats = (CMFormat *)0x0;
        }
        if (*(long *)&in_stack_ffffffffffffffc0->in_format_count != 0) {
          free(*(void **)&in_stack_ffffffffffffffc0->in_format_count);
          *(undefined8 *)&in_stack_ffffffffffffffc0->in_format_count = 0;
        }
        break;
      case (stone_type)0x3:
        break;
      case (stone_type)0x4:
        break;
      case (stone_type)0x5:
      case (stone_type)0x6:
      case (stone_type)0xb:
        if (*(long *)&in_stack_ffffffffffffffc0->CManager_ID != 0) {
          response_data_free(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        }
        break;
      case (stone_type)0x7:
        if (*(long *)&in_stack_ffffffffffffffc0->in_format_count != 0) {
          free_FFSContext(*(undefined8 *)&in_stack_ffffffffffffffc0->in_format_count);
          *(undefined8 *)&in_stack_ffffffffffffffc0->in_format_count = 0;
        }
        break;
      case (stone_type)0x9:
        break;
      case (stone_type)0xa:
        storage_queue_cleanup
                  (in_stack_ffffffffffffff80,(storage_queue_ptr)in_stack_ffffffffffffff78);
      }
    }
    while (local_20->queue->queue_head != (queue_item *)0x0) {
      in_stack_ffffffffffffffa8 =
           dequeue_event(in_stack_ffffffffffffffa0,(stone_type)in_stack_ffffffffffffff98);
      return_event((event_path_data)in_stack_ffffffffffffffc0,
                   (event_item *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    if (local_20->proto_actions != (_proto_action *)0x0) {
      free(local_20->proto_actions);
    }
    iVar1 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    if (local_20->response_cache != (response_cache_element *)0x0) {
      free_response_cache(in_stack_ffffffffffffff90);
    }
    free(local_20->queue);
    local_20->queue = (queue_ptr)0x0;
    local_20->proto_action_count = 0;
    local_20->proto_actions = (_proto_action *)0x0;
    if (local_20->stone_attrs != (attr_list)0x0) {
      CMint_free_attr_list
                (in_stack_ffffffffffffffb0,(attr_list)in_stack_ffffffffffffffa8,
                 (char *)in_stack_ffffffffffffffa0,iVar1);
      local_20->stone_attrs = (attr_list)0x0;
    }
    free(local_20->output_stone_ids);
    remove_stone_from_lookup(local_18,local_c);
    local_18->stone_map[local_20->local_id - local_18->stone_base_num] = (stone_type)0x0;
    local_20->local_id = -1;
    free(local_20);
  }
  return;
}

Assistant:

void
INT_EVfree_stone(CManager cm, EVstone stone_num)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    int i;

    stone = stone_struct(evp, stone_num);
    CMtrace_out(cm, CMFreeVerbose, "Freeing stone %d\n", stone_num);
    if (stone == NULL) return;
    if (stone->local_id == -1) return;
    if (stone->periodic_handle != NULL) {
	INT_CMremove_task(stone->periodic_handle);
	stone->periodic_handle = NULL;
    }
    for(i = 0; i < stone->proto_action_count; i++) {
	proto_action *act = &stone->proto_actions[i];
	if (act->attrs != NULL) {
	    INT_CMfree_attr_list(cm, act->attrs);
	}
	if (act->matching_reference_formats != NULL) 
	    free(act->matching_reference_formats);
	switch(act->action_type) {
	case Action_NoAction:
	case Action_Source:
	case Action_Encode_to_Buffer:
	case Action_Thread_Bridge:
	    break;
	case Action_Bridge:
	    if (act->o.bri.conn) {
		CMtrace_out(cm, CMFreeVerbose, "Closing and dereferencing conn %p in free stone\n", act->o.bri.conn);
		INT_CMConnection_dereference(act->o.bri.conn);
	    }
            if (act->o.bri.remote_contact) {
                free_attr_list(act->o.bri.remote_contact);
                act->o.bri.remote_contact = NULL;
            }
	    if (act->o.bri.remote_path) {
		free(act->o.bri.remote_path);
                act->o.bri.remote_path = NULL;
            }
	    break;
	case Action_Terminal:
	    break;
	case Action_Filter:
	    break;
	case Action_Decode:
	    if (act->o.decode.context) {
		free_FFSContext(act->o.decode.context);
		act->o.decode.context = NULL;
	    }
	    break;
	case Action_Split:
	    break;
	case Action_Immediate:
        case Action_Multi:
        case Action_Congestion:
	    if (act->o.imm.mutable_response_data != NULL) {
		response_data_free(cm, act->o.imm.mutable_response_data);
	    }
	    break;
        case Action_Store:
            storage_queue_cleanup(cm, &act->o.store.queue);
            break; 
	}
    }
    while (stone->queue->queue_head != NULL) {
      event_item *event = dequeue_event(cm, stone);
      return_event(evp, event);
    }
    if (stone->proto_actions != NULL) free(stone->proto_actions);
    if (stone->response_cache != NULL) free_response_cache(stone);
    
    free(stone->queue);
      
    /* XXX unsquelch senders */
    stone->queue = NULL;
    stone->proto_action_count = 0;
    stone->proto_actions = NULL;
    if (stone->stone_attrs != NULL) {
	INT_CMfree_attr_list(cm, stone->stone_attrs);
	stone->stone_attrs = NULL;
    }
    free(stone->output_stone_ids);
    remove_stone_from_lookup(evp, stone_num);
    evp->stone_map[stone->local_id - evp->stone_base_num] = NULL;
    stone->local_id = -1;
    free(stone);
}